

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetItemDefaultFocus(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *window;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiContext *g;
  float fVar8;
  
  pIVar6 = GImGui;
  window = GImGui->CurrentWindow;
  if ((((window->Appearing == true) &&
       (pIVar5 = GImGui->NavWindow, pIVar5 == window->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (pIVar5->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar6->NavInitResultId = (pIVar5->DC).LastItemId;
    fVar8 = (pIVar5->Pos).x;
    fVar1 = (pIVar5->Pos).y;
    fVar2 = (pIVar5->DC).LastItemRect.Min.y;
    fVar3 = (pIVar5->DC).LastItemRect.Max.x;
    fVar4 = (pIVar5->DC).LastItemRect.Max.y;
    (pIVar6->NavInitResultRectRel).Min.x = (pIVar5->DC).LastItemRect.Min.x - fVar8;
    (pIVar6->NavInitResultRectRel).Min.y = fVar2 - fVar1;
    (pIVar6->NavInitResultRectRel).Max.x = fVar3 - fVar8;
    (pIVar6->NavInitResultRectRel).Max.y = fVar4 - fVar1;
    if (pIVar6->NavMoveRequest == false) {
      pIVar6->NavAnyRequest = false;
    }
    else {
      pIVar6->NavAnyRequest = true;
      if (pIVar6->NavWindow == (ImGuiWindow *)0x0) {
        __assert_fail("g.NavWindow != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                      ,0x1fdb,"void ImGui::NavUpdateAnyRequestFlag()");
      }
    }
    bVar7 = IsItemVisible();
    if (!bVar7) {
      fVar8 = (pIVar6->Style).ItemSpacing.y * 0.0;
      SetScrollFromPosY(window,(window->DC).PrevLineSize.y * 0.5 + fVar8 + fVar8 +
                               ((window->DC).CursorPosPrevLine.y - (window->Pos).y),0.5);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == g.NavWindow->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = g.NavWindow->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(g.NavWindow->DC.LastItemRect.Min - g.NavWindow->Pos, g.NavWindow->DC.LastItemRect.Max - g.NavWindow->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHereY();
    }
}